

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall fizplex::Base::~Base(Base *this)

{
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *unaff_retaddr;
  
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)unaff_retaddr);
  DVector::~DVector((DVector *)0x1c3f5a);
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

Base() = delete;